

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr_test.cpp
# Opt level: O2

void __thiscall TaggedPointer_Dispatch_Test::TestBody(TaggedPointer_Dispatch_Test *this)

{
  int iVar1;
  AssertHelper *this_00;
  char *pcVar2;
  AssertionResult gtest_ar;
  Handle h14;
  Handle h13;
  Handle h12;
  Handle h11;
  Handle h10;
  Handle h9;
  Handle h8;
  Handle h7;
  Handle h6;
  Handle h5;
  Handle h4;
  Handle h3;
  Handle h2;
  AssertHelper local_48;
  Handle h1;
  AssertHelper local_38;
  IntType<14> it14;
  IntType<13> it13;
  IntType<12> it12;
  IntType<11> it11;
  IntType<10> it10;
  IntType<9> it9;
  IntType<8> it8;
  IntType<7> it7;
  IntType<6> it6;
  IntType<5> it5;
  IntType<4> it4;
  IntType<3> it3;
  IntType<2> it2;
  IntType<1> it1;
  IntType<0> it0;
  Handle h0;
  
  h1.
  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
  .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
           )((ulong)h1.
                    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                    .bits & 0xffffffff00000000);
  h2.
  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
  .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
           )((ulong)h2.
                    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                    .bits & 0xffffffff00000000);
  h0.
  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
  .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
           )((ulong)&it0 | 0x1000000000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","it0.func()",(int *)&h1,(int *)&h2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&h1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&h2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&h2,(Message *)&h1);
LAB_0038a1c9:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h2);
    this_00 = (AssertHelper *)&h1;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    h1.
    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
    .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
             )((ulong)h1.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits & 0xffffffff00000000);
    iVar1 = pbrt::
            TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
            ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                      ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                        *)&h0);
    h2.
    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
    .bits._0_4_ = iVar1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0","h0.func()",(int *)&h1,(int *)&h2);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&h1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&h2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                 ,0x85,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&h2,(Message *)&h1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&h1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    h1.
    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
    .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
             )((ulong)h1.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits & 0xffffffff00000000);
    h2.
    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
    .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
             )((ulong)h2.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0","it0.cfunc()",(int *)&h1,(int *)&h2);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&h1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&h2,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                 ,0x86,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&h2,(Message *)&h1);
      goto LAB_0038a1c9;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    h1.
    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
    .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
             )((ulong)h1.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits & 0xffffffff00000000);
    iVar1 = pbrt::
            TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
            ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                      ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                        *)&h0);
    h2.
    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
    .bits._0_4_ = iVar1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0","h0.cfunc()",(int *)&h1,(int *)&h2);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&h1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&h2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                 ,0x87,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&h2,(Message *)&h1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&h1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    h1.
    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
    .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
             )((ulong)&it1 | 0x2000000000000);
    h2.
    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
    .bits._0_4_ = 1;
    h3.
    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
    .bits._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1","it1.func()",(int *)&h2,(int *)&h3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&h2);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&h3,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                 ,0x8b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&h3,(Message *)&h2);
LAB_0038a47a:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h3);
      this_00 = (AssertHelper *)&h2;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      h2.
      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
      .bits._0_4_ = 1;
      iVar1 = pbrt::
              TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
              ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                        ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                          *)&h1);
      h3.
      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
      .bits._0_4_ = iVar1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"1","h1.func()",(int *)&h2,(int *)&h3);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&h2);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&h3,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                   ,0x8c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&h3,(Message *)&h2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h3);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&h2);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      h2.
      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
      .bits._0_4_ = 1;
      h3.
      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
      .bits._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"1","it1.cfunc()",(int *)&h2,(int *)&h3);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&h2);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&h3,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                   ,0x8d,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&h3,(Message *)&h2);
        goto LAB_0038a47a;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      h2.
      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
      .bits._0_4_ = 1;
      iVar1 = pbrt::
              TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
              ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                        ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                          *)&h1);
      h3.
      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
      .bits._0_4_ = iVar1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"1","h1.cfunc()",(int *)&h2,(int *)&h3);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&h2);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&h3,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                   ,0x8e,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&h3,(Message *)&h2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h3);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&h2);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      h2.
      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
      .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
               )((ulong)&it2 | 0x3000000000000);
      h4.
      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
      .bits._0_4_ = 2;
      h3.
      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
      .bits._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"2","it2.func()",(int *)&h3,(int *)&h4);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&h3);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&h4,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                   ,0x92,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&h4,(Message *)&h3);
LAB_0038a70d:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h4);
        this_00 = (AssertHelper *)&h3;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        h3.
        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
        .bits._0_4_ = 2;
        iVar1 = pbrt::
                TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                          ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                            *)&h2);
        h4.
        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
        .bits._0_4_ = iVar1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"2","h2.func()",(int *)&h3,(int *)&h4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&h3);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&h4,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                     ,0x93,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&h4,(Message *)&h3);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h4);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&h3);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        h3.
        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
        .bits._0_4_ = 2;
        h4.
        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
        .bits._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"2","it2.cfunc()",(int *)&h3,(int *)&h4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&h3);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&h4,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                     ,0x94,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&h4,(Message *)&h3);
          goto LAB_0038a70d;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        h3.
        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
        .bits._0_4_ = 2;
        iVar1 = pbrt::
                TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                          ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                            *)&h2);
        h4.
        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
        .bits._0_4_ = iVar1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"2","h2.cfunc()",(int *)&h3,(int *)&h4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&h3);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&h4,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                     ,0x95,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&h4,(Message *)&h3);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h4);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&h3);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        h3.
        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
        .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                 )((ulong)&it3 | 0x4000000000000);
        h4.
        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
        .bits._0_4_ = 3;
        h5.
        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
        .bits._0_4_ = 3;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"3","it3.func()",(int *)&h4,(int *)&h5);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&h4);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&h5,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                     ,0x99,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&h5,(Message *)&h4);
LAB_0038a998:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h5);
          this_00 = (AssertHelper *)&h4;
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          h4.
          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
          .bits._0_4_ = 3;
          iVar1 = pbrt::
                  TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                  ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                            ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                              *)&h3);
          h5.
          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
          .bits._0_4_ = iVar1;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"3","h3.func()",(int *)&h4,(int *)&h5);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&h4);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&h5,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                       ,0x9a,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&h5,(Message *)&h4);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h5);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&h4);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          h4.
          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
          .bits._0_4_ = 3;
          h5.
          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
          .bits._0_4_ = 3;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"3","it3.cfunc()",(int *)&h4,(int *)&h5);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&h4);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&h5,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                       ,0x9b,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&h5,(Message *)&h4);
            goto LAB_0038a998;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          h4.
          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
          .bits._0_4_ = 3;
          iVar1 = pbrt::
                  TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                  ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                            ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                              *)&h3);
          h5.
          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
          .bits._0_4_ = iVar1;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"3","h3.cfunc()",(int *)&h4,(int *)&h5);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&h4);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&h5,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                       ,0x9c,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&h5,(Message *)&h4);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h5);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&h4);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          h4.
          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
          .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                   )((ulong)&it4 | 0x5000000000000);
          h5.
          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
          .bits._0_4_ = 4;
          h6.
          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
          .bits._0_4_ = 4;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"4","it4.func()",(int *)&h5,(int *)&h6);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&h5);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&h6,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                       ,0xa0,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&h6,(Message *)&h5);
LAB_0038ac2b:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h6);
            this_00 = (AssertHelper *)&h5;
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            h5.
            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
            .bits._0_4_ = 4;
            iVar1 = pbrt::
                    TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                    ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                              ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                *)&h4);
            h6.
            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
            .bits._0_4_ = iVar1;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"4","h4.func()",(int *)&h5,(int *)&h6);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&h5);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&h6,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                         ,0xa1,pcVar2);
              testing::internal::AssertHelper::operator=((AssertHelper *)&h6,(Message *)&h5);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h6);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&h5);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            h5.
            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
            .bits._0_4_ = 4;
            h6.
            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
            .bits._0_4_ = 4;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"4","it4.cfunc()",(int *)&h5,(int *)&h6);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&h5);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&h6,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                         ,0xa2,pcVar2);
              testing::internal::AssertHelper::operator=((AssertHelper *)&h6,(Message *)&h5);
              goto LAB_0038ac2b;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            h5.
            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
            .bits._0_4_ = 4;
            iVar1 = pbrt::
                    TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                    ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                              ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                *)&h4);
            h6.
            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
            .bits._0_4_ = iVar1;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"4","h4.cfunc()",(int *)&h5,(int *)&h6);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&h5);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&h6,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                         ,0xa3,pcVar2);
              testing::internal::AssertHelper::operator=((AssertHelper *)&h6,(Message *)&h5);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h6);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&h5);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            h5.
            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
            .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                     )((ulong)&it5 | 0x6000000000000);
            h6.
            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
            .bits._0_4_ = 5;
            h7.
            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
            .bits._0_4_ = 5;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"5","it5.func()",(int *)&h6,(int *)&h7);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&h6);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&h7,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                         ,0xa7,pcVar2);
              testing::internal::AssertHelper::operator=((AssertHelper *)&h7,(Message *)&h6);
LAB_0038aebe:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h7);
              this_00 = (AssertHelper *)&h6;
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              h6.
              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
              .bits._0_4_ = 5;
              iVar1 = pbrt::
                      TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                      ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                                ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                  *)&h5);
              h7.
              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
              .bits._0_4_ = iVar1;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"5","h5.func()",(int *)&h6,(int *)&h7);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&h6);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&h7,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                           ,0xa8,pcVar2);
                testing::internal::AssertHelper::operator=((AssertHelper *)&h7,(Message *)&h6);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h7);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&h6);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              h6.
              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
              .bits._0_4_ = 5;
              h7.
              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
              .bits._0_4_ = 5;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"5","it5.cfunc()",(int *)&h6,(int *)&h7);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&h6);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&h7,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                           ,0xa9,pcVar2);
                testing::internal::AssertHelper::operator=((AssertHelper *)&h7,(Message *)&h6);
                goto LAB_0038aebe;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              h6.
              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
              .bits._0_4_ = 5;
              iVar1 = pbrt::
                      TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                      ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                                ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                  *)&h5);
              h7.
              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
              .bits._0_4_ = iVar1;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"5","h5.cfunc()",(int *)&h6,(int *)&h7);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&h6);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&h7,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                           ,0xaa,pcVar2);
                testing::internal::AssertHelper::operator=((AssertHelper *)&h7,(Message *)&h6);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h7);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&h6);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              h6.
              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
              .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                       )((ulong)&it6 | 0x7000000000000);
              h7.
              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
              .bits._0_4_ = 6;
              h8.
              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
              .bits._0_4_ = 6;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"6","it6.func()",(int *)&h7,(int *)&h8);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&h7);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&h8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                           ,0xae,pcVar2);
                testing::internal::AssertHelper::operator=((AssertHelper *)&h8,(Message *)&h7);
LAB_0038b151:
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h8);
                this_00 = (AssertHelper *)&h7;
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                h7.
                super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                .bits._0_4_ = 6;
                iVar1 = pbrt::
                        TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                        ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                                  ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                    *)&h6);
                h8.
                super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                .bits._0_4_ = iVar1;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"6","h6.func()",(int *)&h7,(int *)&h8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&h7);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&h8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                             ,0xaf,pcVar2);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&h8,(Message *)&h7);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h8);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&h7);
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                h7.
                super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                .bits._0_4_ = 6;
                h8.
                super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                .bits._0_4_ = 6;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"6","it6.cfunc()",(int *)&h7,(int *)&h8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&h7);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&h8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                             ,0xb0,pcVar2);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&h8,(Message *)&h7);
                  goto LAB_0038b151;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                h7.
                super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                .bits._0_4_ = 6;
                iVar1 = pbrt::
                        TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                        ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                                  ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                    *)&h6);
                h8.
                super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                .bits._0_4_ = iVar1;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"6","h6.cfunc()",(int *)&h7,(int *)&h8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&h7);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&h8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                             ,0xb1,pcVar2);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&h8,(Message *)&h7);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h8);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&h7);
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                h7.
                super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                         )((ulong)&it7 | 0x8000000000000);
                h8.
                super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                .bits._0_4_ = 7;
                h9.
                super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                .bits._0_4_ = 7;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"7","it7.func()",(int *)&h8,(int *)&h9);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&h8);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&h9,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                             ,0xb5,pcVar2);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&h9,(Message *)&h8);
LAB_0038b3dc:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h9);
                  this_00 = (AssertHelper *)&h8;
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  h8.
                  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                  .bits._0_4_ = 7;
                  iVar1 = pbrt::
                          TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                          ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                                    ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                      *)&h7);
                  h9.
                  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                  .bits._0_4_ = iVar1;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"7","h7.func()",(int *)&h8,(int *)&h9);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&h8);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&h9,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                               ,0xb6,pcVar2);
                    testing::internal::AssertHelper::operator=((AssertHelper *)&h9,(Message *)&h8);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h9);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&h8);
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  h8.
                  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                  .bits._0_4_ = 7;
                  h9.
                  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                  .bits._0_4_ = 7;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"7","it7.cfunc()",(int *)&h8,(int *)&h9);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&h8);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&h9,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                               ,0xb7,pcVar2);
                    testing::internal::AssertHelper::operator=((AssertHelper *)&h9,(Message *)&h8);
                    goto LAB_0038b3dc;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  h8.
                  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                  .bits._0_4_ = 7;
                  iVar1 = pbrt::
                          TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                          ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                                    ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                      *)&h7);
                  h9.
                  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                  .bits._0_4_ = iVar1;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"7","h7.cfunc()",(int *)&h8,(int *)&h9);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&h8);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&h9,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                               ,0xb8,pcVar2);
                    testing::internal::AssertHelper::operator=((AssertHelper *)&h9,(Message *)&h8);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h9);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&h8);
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  h8.
                  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                  .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                           )((ulong)&it8 | 0x9000000000000);
                  h9.
                  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                  .bits._0_4_ = 8;
                  h10.
                  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                  .bits._0_4_ = 8;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"8","it8.func()",(int *)&h9,(int *)&h10);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&h9);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&h10,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                               ,0xbc,pcVar2);
                    testing::internal::AssertHelper::operator=((AssertHelper *)&h10,(Message *)&h9);
LAB_0038b66f:
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h10);
                    this_00 = (AssertHelper *)&h9;
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar.message_);
                    h9.
                    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                    .bits._0_4_ = 8;
                    iVar1 = pbrt::
                            TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                            ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                                      ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                        *)&h8);
                    h10.
                    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                    .bits._0_4_ = iVar1;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&gtest_ar,"8","h8.func()",(int *)&h9,(int *)&h10);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&h9);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&h10,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                 ,0xbd,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&h10,(Message *)&h9);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h10);
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&h9);
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar.message_);
                    h9.
                    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                    .bits._0_4_ = 8;
                    h10.
                    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                    .bits._0_4_ = 8;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&gtest_ar,"8","it8.cfunc()",(int *)&h9,(int *)&h10);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&h9);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&h10,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                 ,0xbe,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&h10,(Message *)&h9);
                      goto LAB_0038b66f;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar.message_);
                    h9.
                    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                    .bits._0_4_ = 8;
                    iVar1 = pbrt::
                            TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                            ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                                      ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                        *)&h8);
                    h10.
                    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                    .bits._0_4_ = iVar1;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&gtest_ar,"8","h8.cfunc()",(int *)&h9,(int *)&h10);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&h9);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&h10,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                 ,0xbf,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&h10,(Message *)&h9);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h10);
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&h9);
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar.message_);
                    h9.
                    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                    .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                             )((ulong)&it9 | 0xa000000000000);
                    h10.
                    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                    .bits._0_4_ = 9;
                    h11.
                    super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                    .bits._0_4_ = 9;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&gtest_ar,"9","it9.func()",(int *)&h10,(int *)&h11);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&h10);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&h11,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                 ,0xc3,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&h11,(Message *)&h10);
LAB_0038b902:
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h11);
                      this_00 = (AssertHelper *)&h10;
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar.message_);
                      h10.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits._0_4_ = 9;
                      iVar1 = pbrt::
                              TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                              ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                                        ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                          *)&h9);
                      h11.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits._0_4_ = iVar1;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&gtest_ar,"9","h9.func()",(int *)&h10,(int *)&h11);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&h10);
                        if (gtest_ar.message_.ptr_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar2 = "";
                        }
                        else {
                          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&h11,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                   ,0xc4,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&h11,(Message *)&h10);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h11);
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&h10);
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar.message_);
                      h10.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits._0_4_ = 9;
                      h11.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits._0_4_ = 9;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&gtest_ar,"9","it9.cfunc()",(int *)&h10,(int *)&h11);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&h10);
                        if (gtest_ar.message_.ptr_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar2 = "";
                        }
                        else {
                          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&h11,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                   ,0xc5,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&h11,(Message *)&h10);
                        goto LAB_0038b902;
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar.message_);
                      h10.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits._0_4_ = 9;
                      iVar1 = pbrt::
                              TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                              ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                                        ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                          *)&h9);
                      h11.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits._0_4_ = iVar1;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&gtest_ar,"9","h9.cfunc()",(int *)&h10,(int *)&h11);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&h10);
                        if (gtest_ar.message_.ptr_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar2 = "";
                        }
                        else {
                          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&h11,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                   ,0xc6,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&h11,(Message *)&h10);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h11);
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&h10);
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar.message_);
                      h10.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                               )((ulong)&it10 | 0xb000000000000);
                      h11.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits._0_4_ = 10;
                      h12.
                      super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                      .bits._0_4_ = 10;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&gtest_ar,"10","it10.func()",(int *)&h11,(int *)&h12);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&h11);
                        if (gtest_ar.message_.ptr_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar2 = "";
                        }
                        else {
                          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&h12,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                   ,0xca,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&h12,(Message *)&h11);
LAB_0038bb95:
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h12);
                        this_00 = (AssertHelper *)&h11;
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar.message_);
                        h11.
                        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                        .bits._0_4_ = 10;
                        iVar1 = pbrt::
                                TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                                          ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                            *)&h10);
                        h12.
                        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                        .bits._0_4_ = iVar1;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&gtest_ar,"10","h10.func()",(int *)&h11,(int *)&h12);
                        if (gtest_ar.success_ == false) {
                          testing::Message::Message((Message *)&h11);
                          if (gtest_ar.message_.ptr_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&h12,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                     ,0xcb,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&h12,(Message *)&h11);
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h12);
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&h11);
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar.message_);
                        h11.
                        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                        .bits._0_4_ = 10;
                        h12.
                        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                        .bits._0_4_ = 10;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&gtest_ar,"10","it10.cfunc()",(int *)&h11,(int *)&h12
                                  );
                        if (gtest_ar.success_ == false) {
                          testing::Message::Message((Message *)&h11);
                          if (gtest_ar.message_.ptr_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&h12,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                     ,0xcc,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&h12,(Message *)&h11);
                          goto LAB_0038bb95;
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar.message_);
                        h11.
                        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                        .bits._0_4_ = 10;
                        iVar1 = pbrt::
                                TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                                          ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                            *)&h10);
                        h12.
                        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                        .bits._0_4_ = iVar1;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&gtest_ar,"10","h10.cfunc()",(int *)&h11,(int *)&h12)
                        ;
                        if (gtest_ar.success_ == false) {
                          testing::Message::Message((Message *)&h11);
                          if (gtest_ar.message_.ptr_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&h12,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                     ,0xcd,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&h12,(Message *)&h11);
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h12);
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&h11);
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar.message_);
                        h11.
                        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                        .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                                 )((ulong)&it11 | 0xc000000000000);
                        h12.
                        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                        .bits._0_4_ = 0xb;
                        h13.
                        super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                        .bits._0_4_ = 0xb;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&gtest_ar,"11","it11.func()",(int *)&h12,(int *)&h13)
                        ;
                        if (gtest_ar.success_ == false) {
                          testing::Message::Message((Message *)&h12);
                          if (gtest_ar.message_.ptr_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&h13,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                     ,0xd1,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&h13,(Message *)&h12);
LAB_0038be28:
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h13);
                          this_00 = (AssertHelper *)&h12;
                        }
                        else {
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr(&gtest_ar.message_);
                          h12.
                          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                          .bits._0_4_ = 0xb;
                          iVar1 = pbrt::
                                  TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                  ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                                            ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                              *)&h11);
                          h13.
                          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                          .bits._0_4_ = iVar1;
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"11","h11.func()",(int *)&h12,(int *)&h13
                                    );
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&h12);
                            if (gtest_ar.message_.ptr_ ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar2 = "";
                            }
                            else {
                              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&h13,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                       ,0xd2,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&h13,(Message *)&h12);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h13);
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&h12);
                          }
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr(&gtest_ar.message_);
                          h12.
                          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                          .bits._0_4_ = 0xb;
                          h13.
                          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                          .bits._0_4_ = 0xb;
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"11","it11.cfunc()",(int *)&h12,
                                     (int *)&h13);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&h12);
                            if (gtest_ar.message_.ptr_ ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar2 = "";
                            }
                            else {
                              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&h13,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                       ,0xd3,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&h13,(Message *)&h12);
                            goto LAB_0038be28;
                          }
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr(&gtest_ar.message_);
                          h12.
                          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                          .bits._0_4_ = 0xb;
                          iVar1 = pbrt::
                                  TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                  ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                                            ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                              *)&h11);
                          h13.
                          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                          .bits._0_4_ = iVar1;
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"11","h11.cfunc()",(int *)&h12,
                                     (int *)&h13);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&h12);
                            if (gtest_ar.message_.ptr_ ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar2 = "";
                            }
                            else {
                              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&h13,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                       ,0xd4,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&h13,(Message *)&h12);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h13);
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&h12);
                          }
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr(&gtest_ar.message_);
                          h12.
                          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                          .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                                   )((ulong)&it12 | 0xd000000000000);
                          h13.
                          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                          .bits._0_4_ = 0xc;
                          h14.
                          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                          .bits._0_4_ = 0xc;
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"12","it12.func()",(int *)&h13,
                                     (int *)&h14);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&h13);
                            if (gtest_ar.message_.ptr_ ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar2 = "";
                            }
                            else {
                              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&h14,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                       ,0xd8,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&h14,(Message *)&h13);
LAB_0038c0bb:
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h14);
                            this_00 = (AssertHelper *)&h13;
                          }
                          else {
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr(&gtest_ar.message_);
                            h13.
                            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                            .bits._0_4_ = 0xc;
                            iVar1 = pbrt::
                                    TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                    ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                                              ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                                *)&h12);
                            h14.
                            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                            .bits._0_4_ = iVar1;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)&gtest_ar,"12","h12.func()",(int *)&h13,
                                       (int *)&h14);
                            if (gtest_ar.success_ == false) {
                              testing::Message::Message((Message *)&h13);
                              if (gtest_ar.message_.ptr_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar2 = "";
                              }
                              else {
                                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&h14,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                         ,0xd9,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&h14,(Message *)&h13);
                              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h14);
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&h13);
                            }
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr(&gtest_ar.message_);
                            h13.
                            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                            .bits._0_4_ = 0xc;
                            h14.
                            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                            .bits._0_4_ = 0xc;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)&gtest_ar,"12","it12.cfunc()",(int *)&h13,
                                       (int *)&h14);
                            if (gtest_ar.success_ == false) {
                              testing::Message::Message((Message *)&h13);
                              if (gtest_ar.message_.ptr_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar2 = "";
                              }
                              else {
                                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&h14,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                         ,0xda,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&h14,(Message *)&h13);
                              goto LAB_0038c0bb;
                            }
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr(&gtest_ar.message_);
                            h13.
                            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                            .bits._0_4_ = 0xc;
                            iVar1 = pbrt::
                                    TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                    ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                                              ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                                *)&h12);
                            h14.
                            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                            .bits._0_4_ = iVar1;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)&gtest_ar,"12","h12.cfunc()",(int *)&h13,
                                       (int *)&h14);
                            if (gtest_ar.success_ == false) {
                              testing::Message::Message((Message *)&h13);
                              if (gtest_ar.message_.ptr_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar2 = "";
                              }
                              else {
                                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&h14,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                         ,0xdb,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&h14,(Message *)&h13);
                              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&h14);
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&h13);
                            }
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr(&gtest_ar.message_);
                            h13.
                            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                            .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                                     )((ulong)&it13 | 0xe000000000000);
                            h14.
                            super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                            .bits._0_4_ = 0xd;
                            local_48.data_._0_4_ = 0xd;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)&gtest_ar,"13","it13.func()",(int *)&h14,
                                       (int *)&local_48);
                            if (gtest_ar.success_ == false) {
                              testing::Message::Message((Message *)&h14);
                              if (gtest_ar.message_.ptr_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar2 = "";
                              }
                              else {
                                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_48,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                         ,0xdf,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_48,(Message *)&h14);
LAB_0038c36f:
                              testing::internal::AssertHelper::~AssertHelper(&local_48);
                              this_00 = (AssertHelper *)&h14;
                            }
                            else {
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar.message_);
                              h14.
                              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                              .bits._0_4_ = 0xd;
                              local_48.data_._0_4_ =
                                   pbrt::
                                   TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                   ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                                             ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                               *)&h13);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)&gtest_ar,"13","h13.func()",(int *)&h14,
                                         (int *)&local_48);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&h14);
                                if (gtest_ar.message_.ptr_ ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                           ,0xe0,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&h14);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&h14);
                              }
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar.message_);
                              h14.
                              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                              .bits._0_4_ = 0xd;
                              local_48.data_._0_4_ = 0xd;
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)&gtest_ar,"13","it13.cfunc()",(int *)&h14,
                                         (int *)&local_48);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&h14);
                                if (gtest_ar.message_.ptr_ ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                           ,0xe1,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&h14);
                                goto LAB_0038c36f;
                              }
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar.message_);
                              h14.
                              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                              .bits._0_4_ = 0xd;
                              local_48.data_._0_4_ =
                                   pbrt::
                                   TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                   ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                                             ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                               *)&h13);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)&gtest_ar,"13","h13.cfunc()",(int *)&h14,
                                         (int *)&local_48);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&h14);
                                if (gtest_ar.message_.ptr_ ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                           ,0xe2,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&h14);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&h14);
                              }
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar.message_);
                              h14.
                              super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                              .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
                                       )((ulong)&it14 | 0xf000000000000);
                              iVar1 = 0xe;
                              local_48.data_._0_4_ = iVar1;
                              local_38.data_._0_4_ = iVar1;
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)&gtest_ar,"14","it14.func()",(int *)&local_48,
                                         (int *)&local_38);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&local_48);
                                if (gtest_ar.message_.ptr_ ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_38,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                           ,0xe6,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          (&local_38,(Message *)&local_48);
                              }
                              else {
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr(&gtest_ar.message_);
                                local_48.data_._0_4_ = 0xe;
                                local_38.data_._0_4_ =
                                     pbrt::
                                     TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                     ::DispatchCPU<Handle::func()::_lambda(auto:1)_1_>
                                               ((TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                                 *)&h14);
                                testing::internal::CmpHelperEQ<int,int>
                                          ((internal *)&gtest_ar,"14","h14.func()",(int *)&local_48,
                                           (int *)&local_38);
                                if (gtest_ar.success_ == false) {
                                  testing::Message::Message((Message *)&local_48);
                                  if (gtest_ar.message_.ptr_ ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar2 = "";
                                  }
                                  else {
                                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_38,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                             ,0xe7,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_38,(Message *)&local_48);
                                  testing::internal::AssertHelper::~AssertHelper(&local_38);
                                  testing::internal::
                                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)&local_48);
                                }
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr(&gtest_ar.message_);
                                local_48.data_._0_4_ = iVar1;
                                local_38.data_._0_4_ = iVar1;
                                testing::internal::CmpHelperEQ<int,int>
                                          ((internal *)&gtest_ar,"14","it14.cfunc()",
                                           (int *)&local_48,(int *)&local_38);
                                if (gtest_ar.success_ != false) {
                                  testing::internal::
                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~scoped_ptr(&gtest_ar.message_);
                                  local_48.data_._0_4_ = 0xe;
                                  local_38.data_._0_4_ =
                                       pbrt::
                                       TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                       ::DispatchCPU<Handle::cfunc()const::_lambda(auto:1)_1_>
                                                 ((
                                                  TaggedPointer<IntType<0>,IntType<1>,IntType<2>,IntType<3>,IntType<4>,IntType<5>,IntType<6>,IntType<7>,IntType<8>,IntType<9>,IntType<10>,IntType<11>,IntType<12>,IntType<13>,IntType<14>>
                                                  *)&h14);
                                  testing::internal::CmpHelperEQ<int,int>
                                            ((internal *)&gtest_ar,"14","h14.cfunc()",
                                             (int *)&local_48,(int *)&local_38);
                                  if (gtest_ar.success_ == false) {
                                    testing::Message::Message((Message *)&local_48);
                                    if (gtest_ar.message_.ptr_ ==
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      pcVar2 = "";
                                    }
                                    else {
                                      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_38,kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                               ,0xe9,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              (&local_38,(Message *)&local_48);
                                    testing::internal::AssertHelper::~AssertHelper(&local_38);
                                    testing::internal::
                                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_48);
                                  }
                                  goto LAB_0038a1e8;
                                }
                                testing::Message::Message((Message *)&local_48);
                                if (gtest_ar.message_.ptr_ ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_38,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                           ,0xe8,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          (&local_38,(Message *)&local_48);
                              }
                              testing::internal::AssertHelper::~AssertHelper(&local_38);
                              this_00 = &local_48;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
LAB_0038a1e8:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(TaggedPointer, Dispatch) {
    IntType<0> it0;
    Handle h0(&it0);
    ASSERT_EQ(0, it0.func());
    EXPECT_EQ(0, h0.func());
    ASSERT_EQ(0, it0.cfunc());
    EXPECT_EQ(0, h0.cfunc());

    IntType<1> it1;
    Handle h1(&it1);
    ASSERT_EQ(1, it1.func());
    EXPECT_EQ(1, h1.func());
    ASSERT_EQ(1, it1.cfunc());
    EXPECT_EQ(1, h1.cfunc());

    IntType<2> it2;
    Handle h2(&it2);
    ASSERT_EQ(2, it2.func());
    EXPECT_EQ(2, h2.func());
    ASSERT_EQ(2, it2.cfunc());
    EXPECT_EQ(2, h2.cfunc());

    IntType<3> it3;
    Handle h3(&it3);
    ASSERT_EQ(3, it3.func());
    EXPECT_EQ(3, h3.func());
    ASSERT_EQ(3, it3.cfunc());
    EXPECT_EQ(3, h3.cfunc());

    IntType<4> it4;
    Handle h4(&it4);
    ASSERT_EQ(4, it4.func());
    EXPECT_EQ(4, h4.func());
    ASSERT_EQ(4, it4.cfunc());
    EXPECT_EQ(4, h4.cfunc());

    IntType<5> it5;
    Handle h5(&it5);
    ASSERT_EQ(5, it5.func());
    EXPECT_EQ(5, h5.func());
    ASSERT_EQ(5, it5.cfunc());
    EXPECT_EQ(5, h5.cfunc());

    IntType<6> it6;
    Handle h6(&it6);
    ASSERT_EQ(6, it6.func());
    EXPECT_EQ(6, h6.func());
    ASSERT_EQ(6, it6.cfunc());
    EXPECT_EQ(6, h6.cfunc());

    IntType<7> it7;
    Handle h7(&it7);
    ASSERT_EQ(7, it7.func());
    EXPECT_EQ(7, h7.func());
    ASSERT_EQ(7, it7.cfunc());
    EXPECT_EQ(7, h7.cfunc());

    IntType<8> it8;
    Handle h8(&it8);
    ASSERT_EQ(8, it8.func());
    EXPECT_EQ(8, h8.func());
    ASSERT_EQ(8, it8.cfunc());
    EXPECT_EQ(8, h8.cfunc());

    IntType<9> it9;
    Handle h9(&it9);
    ASSERT_EQ(9, it9.func());
    EXPECT_EQ(9, h9.func());
    ASSERT_EQ(9, it9.cfunc());
    EXPECT_EQ(9, h9.cfunc());

    IntType<10> it10;
    Handle h10(&it10);
    ASSERT_EQ(10, it10.func());
    EXPECT_EQ(10, h10.func());
    ASSERT_EQ(10, it10.cfunc());
    EXPECT_EQ(10, h10.cfunc());

    IntType<11> it11;
    Handle h11(&it11);
    ASSERT_EQ(11, it11.func());
    EXPECT_EQ(11, h11.func());
    ASSERT_EQ(11, it11.cfunc());
    EXPECT_EQ(11, h11.cfunc());

    IntType<12> it12;
    Handle h12(&it12);
    ASSERT_EQ(12, it12.func());
    EXPECT_EQ(12, h12.func());
    ASSERT_EQ(12, it12.cfunc());
    EXPECT_EQ(12, h12.cfunc());

    IntType<13> it13;
    Handle h13(&it13);
    ASSERT_EQ(13, it13.func());
    EXPECT_EQ(13, h13.func());
    ASSERT_EQ(13, it13.cfunc());
    EXPECT_EQ(13, h13.cfunc());

    IntType<14> it14;
    Handle h14(&it14);
    ASSERT_EQ(14, it14.func());
    EXPECT_EQ(14, h14.func());
    ASSERT_EQ(14, it14.cfunc());
    EXPECT_EQ(14, h14.cfunc());
}